

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O2

bool __thiscall ON_RTreeIterator::Next(ON_RTreeIterator *this)

{
  ON_RTreeIterator *pOVar1;
  ON_RTreeIterator *pOVar2;
  bool bVar3;
  ON_RTreeIterator *pOVar4;
  int iVar5;
  
  pOVar4 = (ON_RTreeIterator *)this->m_sp;
  if (pOVar4 != (ON_RTreeIterator *)0x0) {
    iVar5 = pOVar4->m_stack[0].m_branchIndex + 1;
    pOVar4->m_stack[0].m_branchIndex = iVar5;
    if (iVar5 < (pOVar4->m_stack[0].m_node)->m_count) {
      return true;
    }
    this->m_sp = (StackElement *)0x0;
    while (this < pOVar4) {
      pOVar1 = pOVar4 + -1;
      iVar5 = *(int *)&pOVar4[-1].m_root + 1;
      *(int *)&pOVar4[-1].m_root = iVar5;
      pOVar2 = pOVar4 + -1;
      pOVar4 = (ON_RTreeIterator *)&pOVar1->m_sp;
      if (iVar5 < *(int *)((long)&pOVar2->m_sp->m_node + 4)) {
        bVar3 = PushChildren(this,(StackElement *)&pOVar1->m_sp,true);
        return bVar3;
      }
    }
  }
  return false;
}

Assistant:

bool ON_RTreeIterator::Next()
{ 
  if ( 0 == m_sp )
    return false; // invalid iterator

  if ( ++(m_sp->m_branchIndex) < m_sp->m_node->m_count )
    return true; // m_sp->m_node is always at leaf level

  // pop the stack until we find an element with room to move over.
  StackElement* sp0 = &m_stack[0];
  StackElement* sp = m_sp;
  m_sp = 0;
  while ( sp > sp0 )
  {        
    sp--; // pop the stack

    // ++(sp->m_branchIndex) moves to the next element in sp->m_node.
    if ( ++(sp->m_branchIndex) >= sp->m_node->m_count )
      continue; // this element is used up

    // Since we've popped the stack, we cannot be at the leaf level.
    // PushFirst() pushes the first child onto the stack until 
    // it reaches the leaf level.
    return PushChildren(sp,true);
  }
  return false; // we were at the last element and now there are no more.
}